

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint-spbset.c
# Opt level: O3

_Bool Curl_uint_spbset_next(uint_spbset *bset,uint last,uint *pnext)

{
  _Bool _Var1;
  uint uVar2;
  ulong uVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  
  uVar7 = 0xffffffff;
  if (bset != (uint_spbset *)0x0) {
    uVar6 = last + 1;
    uVar8 = uVar6 & 0xffffff00;
    do {
      if (uVar8 <= (bset->head).offset) {
        if ((bset->head).offset != uVar8) goto LAB_0015f5b3;
        uVar2 = uVar6 >> 6 & 3;
        uVar3 = (ulong)uVar2;
        uVar9 = (bset->head).slots[uVar3] >> ((byte)uVar6 & 0x3f);
        if (uVar9 != 0) {
          lVar5 = 0;
          if (uVar9 != 0) {
            for (; (uVar9 >> lVar5 & 1) == 0; lVar5 = lVar5 + 1) {
            }
          }
          uVar7 = uVar6 + (int)lVar5;
          _Var1 = true;
          goto LAB_0015f5f9;
        }
        iVar4 = -(uVar2 * 0x40 + uVar8);
        goto LAB_0015f586;
      }
      bset = (uint_spbset *)(bset->head).next;
    } while ((uint_spbset_chunk *)bset != (uint_spbset_chunk *)0x0);
  }
LAB_0015f54f:
  _Var1 = false;
  goto LAB_0015f5f9;
LAB_0015f5b3:
  uVar3 = (bset->head).slots[0];
  if (uVar3 == 0) goto code_r0x0015f5bc;
  lVar5 = 0;
  if (uVar3 != 0) {
    for (; (uVar3 >> lVar5 & 1) == 0; lVar5 = lVar5 + 1) {
    }
  }
  uVar7 = (int)lVar5 + (bset->head).offset;
  goto LAB_0015f5f7;
code_r0x0015f5bc:
  iVar4 = 0;
  lVar5 = 2;
  while (lVar5 != 5) {
    uVar3 = (bset->head).slots[lVar5 + -1];
    iVar4 = iVar4 + -0x40;
    lVar5 = lVar5 + 1;
    if (uVar3 != 0) {
      lVar5 = 0;
      if (uVar3 != 0) {
        for (; (uVar3 >> lVar5 & 1) == 0; lVar5 = lVar5 + 1) {
        }
      }
      uVar7 = ((int)lVar5 + (bset->head).offset) - iVar4;
      goto LAB_0015f5f7;
    }
  }
  *pnext = 0xffffffff;
  bset = (uint_spbset *)((uint_spbset_chunk *)&(bset->head).next)->next;
  _Var1 = false;
  if ((uint_spbset_chunk *)bset == (uint_spbset_chunk *)0x0) goto LAB_0015f5f9;
  goto LAB_0015f5b3;
  while( true ) {
    uVar9 = (bset->head).slots[uVar3 + 1];
    uVar3 = uVar3 + 1;
    iVar4 = iVar4 + -0x40;
    if (uVar9 != 0) break;
LAB_0015f586:
    if (uVar3 == 3) {
      *pnext = 0xffffffff;
      bset = (uint_spbset *)(bset->head).next;
      if ((uint_spbset_chunk *)bset == (uint_spbset_chunk *)0x0) goto LAB_0015f54f;
      goto LAB_0015f5b3;
    }
  }
  lVar5 = 0;
  if (uVar9 != 0) {
    for (; (uVar9 >> lVar5 & 1) == 0; lVar5 = lVar5 + 1) {
    }
  }
  uVar7 = (int)lVar5 - iVar4;
LAB_0015f5f7:
  _Var1 = true;
LAB_0015f5f9:
  *pnext = uVar7;
  return _Var1;
}

Assistant:

bool Curl_uint_spbset_next(struct uint_spbset *bset, unsigned int last,
                           unsigned int *pnext)
{
  struct uint_spbset_chunk *chunk;
  unsigned int last_offset;

  ++last; /* look for the next higher number */
  last_offset = (last & ~CURL_UINT_SPBSET_CH_MASK);

  for(chunk = &bset->head; chunk; chunk = chunk->next) {
    if(chunk->offset >= last_offset) {
      break;
    }
  }

  if(chunk && (chunk->offset == last_offset)) {
    /* is there a number higher than last in this chunk? */
    if(uint_spbset_chunk_next(chunk, last, pnext))
      return TRUE;
    /* not in this chunk */
    chunk = chunk->next;
  }
  /* look for the first in the "higher" chunks, if there are any. */
  while(chunk) {
    if(uint_spbset_chunk_first(chunk, pnext))
      return TRUE;
    chunk = chunk->next;
  }
  *pnext = UINT_MAX;
  return FALSE;
}